

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::ReadableDirectory::Entry>::truncate
          (ArrayBuilder<kj::ReadableDirectory::Entry> *this,char *__file,__off_t __length)

{
  Entry *pEVar1;
  Entry *pEVar2;
  char *pcVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  
  pEVar1 = this->ptr;
  pEVar2 = this->pos;
  while (pEVar1 + (long)__file < pEVar2) {
    this->pos = pEVar2 + -1;
    pcVar3 = pEVar2[-1].name.content.ptr;
    if (pcVar3 != (char *)0x0) {
      sVar4 = pEVar2[-1].name.content.size_;
      pEVar2[-1].name.content.ptr = (char *)0x0;
      pEVar2[-1].name.content.size_ = 0;
      pAVar5 = pEVar2[-1].name.content.disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pcVar3,1,sVar4,sVar4,0);
    }
    pEVar2 = this->pos;
  }
  return (int)pEVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }